

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall FfsParser::parseDepexSectionBody(FfsParser *this,UModelIndex *index)

{
  byte bVar1;
  TreeModel *this_00;
  EFI_GUID_ EVar2;
  EFI_GUID_ EVar3;
  EFI_GUID_ EVar4;
  bool bVar5;
  int32_t iVar6;
  char *pcVar7;
  byte *pbVar8;
  EFI_GUID_ EVar9;
  CBString local_380;
  CBString local_368;
  CBString local_350;
  CBString local_338;
  CBString local_320;
  CBString local_308;
  CBString local_2f0;
  CBString local_2d8;
  CBString local_2c0;
  CBString local_2a8;
  EFI_GUID_ local_290;
  CBString local_280;
  CBString local_268;
  CBString local_250;
  CBString local_238;
  CBString local_220;
  CBString local_208;
  CBString local_1f0;
  CBString local_1d8;
  CBString local_1c0;
  CBString local_1a8;
  EFI_GUID_ local_190;
  CBString local_180;
  CBString local_168;
  CBString local_150;
  CBString local_138;
  CBString local_120;
  EFI_GUID_ local_108;
  CBString local_f8;
  CBString local_e0;
  CBString local_c8;
  CBString local_b0;
  byte *local_98;
  UINT8 *current;
  EFI_GUID *guid;
  CBString local_80;
  undefined1 local_58 [8];
  CBString parsed;
  UByteArray body;
  UModelIndex *index_local;
  FfsParser *this_local;
  
  bVar5 = UModelIndex::isValid(index);
  if (!bVar5) {
    return 1;
  }
  TreeModel::body((UByteArray *)&parsed.super_tagbstring.data,this->model,index);
  Bstrlib::CBString::CBString((CBString *)local_58);
  iVar6 = UByteArray::size((UByteArray *)&parsed.super_tagbstring.data);
  if (iVar6 < 2) {
    usprintf(&local_80,"%s: DEPEX section too short","parseDepexSectionBody");
    msg(this,&local_80,index);
    Bstrlib::CBString::~CBString(&local_80);
    EVar9.Data4[0] = local_190.Data4[0];
    EVar9.Data4[1] = local_190.Data4[1];
    EVar9.Data4[2] = local_190.Data4[2];
    EVar9.Data4[3] = local_190.Data4[3];
    EVar9.Data4[4] = local_190.Data4[4];
    EVar9.Data4[5] = local_190.Data4[5];
    EVar9.Data4[6] = local_190.Data4[6];
    EVar9.Data4[7] = local_190.Data4[7];
    EVar9.Data1 = local_190.Data1;
    EVar9.Data2 = local_190.Data2;
    EVar9.Data3 = local_190.Data3;
    this_local = (FfsParser *)0x1c;
  }
  else {
    local_98 = (byte *)UByteArray::constData((UByteArray *)&parsed.super_tagbstring.data);
    bVar1 = *local_98;
    if (bVar1 == 0) {
      iVar6 = UByteArray::size((UByteArray *)&parsed.super_tagbstring.data);
      if (iVar6 == 0x12) {
        current = local_98 + 1;
        Bstrlib::CBString::CBString(&local_e0,"\nBEFORE ");
        local_108 = readUnaligned<EFI_GUID_>((EFI_GUID_ *)current);
        guidToUString(&local_f8,&local_108,true);
        Bstrlib::CBString::operator+(&local_c8,&local_e0,&local_f8);
        Bstrlib::CBString::operator+=((CBString *)local_58,&local_c8);
        Bstrlib::CBString::~CBString(&local_c8);
        Bstrlib::CBString::~CBString(&local_f8);
        Bstrlib::CBString::~CBString(&local_e0);
        EVar4.Data4[0] = local_290.Data4[0];
        EVar4.Data4[1] = local_290.Data4[1];
        EVar4.Data4[2] = local_290.Data4[2];
        EVar4.Data4[3] = local_290.Data4[3];
        EVar4.Data4[4] = local_290.Data4[4];
        EVar4.Data4[5] = local_290.Data4[5];
        EVar4.Data4[6] = local_290.Data4[6];
        EVar4.Data4[7] = local_290.Data4[7];
        EVar4.Data1 = local_290.Data1;
        EVar4.Data2 = local_290.Data2;
        EVar4.Data3 = local_290.Data3;
        EVar9.Data4[0] = local_190.Data4[0];
        EVar9.Data4[1] = local_190.Data4[1];
        EVar9.Data4[2] = local_190.Data4[2];
        EVar9.Data4[3] = local_190.Data4[3];
        EVar9.Data4[4] = local_190.Data4[4];
        EVar9.Data4[5] = local_190.Data4[5];
        EVar9.Data4[6] = local_190.Data4[6];
        EVar9.Data4[7] = local_190.Data4[7];
        EVar9.Data1 = local_190.Data1;
        EVar9.Data2 = local_190.Data2;
        EVar9.Data3 = local_190.Data3;
        local_98 = local_98 + 0x11;
        if (*local_98 == 8) {
          this_local = (FfsParser *)0x0;
          local_290 = EVar4;
        }
        else {
          usprintf(&local_120,"%s: DEPEX section ends with non-END opcode","parseDepexSectionBody");
          msg(this,&local_120,index);
          Bstrlib::CBString::~CBString(&local_120);
          EVar9.Data4[0] = local_190.Data4[0];
          EVar9.Data4[1] = local_190.Data4[1];
          EVar9.Data4[2] = local_190.Data4[2];
          EVar9.Data4[3] = local_190.Data4[3];
          EVar9.Data4[4] = local_190.Data4[4];
          EVar9.Data4[5] = local_190.Data4[5];
          EVar9.Data4[6] = local_190.Data4[6];
          EVar9.Data4[7] = local_190.Data4[7];
          EVar9.Data1 = local_190.Data1;
          EVar9.Data2 = local_190.Data2;
          EVar9.Data3 = local_190.Data3;
          this_local = (FfsParser *)0x0;
        }
      }
      else {
        usprintf(&local_b0,"%s: DEPEX section too long for a section starting with BEFORE opcode",
                 "parseDepexSectionBody");
        msg(this,&local_b0,index);
        Bstrlib::CBString::~CBString(&local_b0);
        EVar9.Data4[0] = local_190.Data4[0];
        EVar9.Data4[1] = local_190.Data4[1];
        EVar9.Data4[2] = local_190.Data4[2];
        EVar9.Data4[3] = local_190.Data4[3];
        EVar9.Data4[4] = local_190.Data4[4];
        EVar9.Data4[5] = local_190.Data4[5];
        EVar9.Data4[6] = local_190.Data4[6];
        EVar9.Data4[7] = local_190.Data4[7];
        EVar9.Data1 = local_190.Data1;
        EVar9.Data2 = local_190.Data2;
        EVar9.Data3 = local_190.Data3;
        this_local = (FfsParser *)0x0;
      }
    }
    else if (bVar1 == 1) {
      iVar6 = UByteArray::size((UByteArray *)&parsed.super_tagbstring.data);
      if (iVar6 == 0x12) {
        current = local_98 + 1;
        Bstrlib::CBString::CBString(&local_168,"\nAFTER ");
        local_190 = readUnaligned<EFI_GUID_>((EFI_GUID_ *)current);
        guidToUString(&local_180,&local_190,true);
        Bstrlib::CBString::operator+(&local_150,&local_168,&local_180);
        Bstrlib::CBString::operator+=((CBString *)local_58,&local_150);
        Bstrlib::CBString::~CBString(&local_150);
        Bstrlib::CBString::~CBString(&local_180);
        Bstrlib::CBString::~CBString(&local_168);
        EVar3.Data4[0] = local_290.Data4[0];
        EVar3.Data4[1] = local_290.Data4[1];
        EVar3.Data4[2] = local_290.Data4[2];
        EVar3.Data4[3] = local_290.Data4[3];
        EVar3.Data4[4] = local_290.Data4[4];
        EVar3.Data4[5] = local_290.Data4[5];
        EVar3.Data4[6] = local_290.Data4[6];
        EVar3.Data4[7] = local_290.Data4[7];
        EVar3.Data1 = local_290.Data1;
        EVar3.Data2 = local_290.Data2;
        EVar3.Data3 = local_290.Data3;
        EVar2.Data4[0] = local_108.Data4[0];
        EVar2.Data4[1] = local_108.Data4[1];
        EVar2.Data4[2] = local_108.Data4[2];
        EVar2.Data4[3] = local_108.Data4[3];
        EVar2.Data4[4] = local_108.Data4[4];
        EVar2.Data4[5] = local_108.Data4[5];
        EVar2.Data4[6] = local_108.Data4[6];
        EVar2.Data4[7] = local_108.Data4[7];
        EVar2.Data1 = local_108.Data1;
        EVar2.Data2 = local_108.Data2;
        EVar2.Data3 = local_108.Data3;
        local_98 = local_98 + 0x11;
        if (*local_98 == 8) {
          this_local = (FfsParser *)0x0;
          local_108 = EVar2;
          EVar9 = local_190;
          local_290 = EVar3;
        }
        else {
          usprintf(&local_1a8,"%s: DEPEX section ends with non-END opcode","parseDepexSectionBody");
          msg(this,&local_1a8,index);
          Bstrlib::CBString::~CBString(&local_1a8);
          this_local = (FfsParser *)0x0;
          EVar9 = local_190;
        }
      }
      else {
        usprintf(&local_138,"%s: DEPEX section too long for a section starting with AFTER opcode",
                 "parseDepexSectionBody");
        msg(this,&local_138,index);
        Bstrlib::CBString::~CBString(&local_138);
        EVar9.Data4[0] = local_190.Data4[0];
        EVar9.Data4[1] = local_190.Data4[1];
        EVar9.Data4[2] = local_190.Data4[2];
        EVar9.Data4[3] = local_190.Data4[3];
        EVar9.Data4[4] = local_190.Data4[4];
        EVar9.Data4[5] = local_190.Data4[5];
        EVar9.Data4[6] = local_190.Data4[6];
        EVar9.Data4[7] = local_190.Data4[7];
        EVar9.Data1 = local_190.Data1;
        EVar9.Data2 = local_190.Data2;
        EVar9.Data3 = local_190.Data3;
        this_local = (FfsParser *)0x0;
      }
    }
    else {
      if (bVar1 == 9) {
        iVar6 = UByteArray::size((UByteArray *)&parsed.super_tagbstring.data);
        if (iVar6 < 3) {
          usprintf(&local_1c0,"%s: DEPEX section too short for a section starting with SOR opcode",
                   "parseDepexSectionBody");
          msg(this,&local_1c0,index);
          Bstrlib::CBString::~CBString(&local_1c0);
          EVar9.Data4[0] = local_190.Data4[0];
          EVar9.Data4[1] = local_190.Data4[1];
          EVar9.Data4[2] = local_190.Data4[2];
          EVar9.Data4[3] = local_190.Data4[3];
          EVar9.Data4[4] = local_190.Data4[4];
          EVar9.Data4[5] = local_190.Data4[5];
          EVar9.Data4[6] = local_190.Data4[6];
          EVar9.Data4[7] = local_190.Data4[7];
          EVar9.Data1 = local_190.Data1;
          EVar9.Data2 = local_190.Data2;
          EVar9.Data3 = local_190.Data3;
          this_local = (FfsParser *)0x0;
          goto LAB_00134fde;
        }
        Bstrlib::CBString::CBString(&local_1d8,"\nSOR");
        Bstrlib::CBString::operator+=((CBString *)local_58,&local_1d8);
        Bstrlib::CBString::~CBString(&local_1d8);
        local_98 = local_98 + 1;
      }
      while( true ) {
        pbVar8 = local_98;
        pcVar7 = UByteArray::constData((UByteArray *)&parsed.super_tagbstring.data);
        iVar6 = UByteArray::size((UByteArray *)&parsed.super_tagbstring.data);
        if ((long)iVar6 <= (long)pbVar8 - (long)pcVar7) break;
        switch(*local_98) {
        case 0:
          usprintf(&local_1f0,"%s: misplaced BEFORE opcode","parseDepexSectionBody");
          msg(this,&local_1f0,index);
          Bstrlib::CBString::~CBString(&local_1f0);
          EVar9.Data4[0] = local_190.Data4[0];
          EVar9.Data4[1] = local_190.Data4[1];
          EVar9.Data4[2] = local_190.Data4[2];
          EVar9.Data4[3] = local_190.Data4[3];
          EVar9.Data4[4] = local_190.Data4[4];
          EVar9.Data4[5] = local_190.Data4[5];
          EVar9.Data4[6] = local_190.Data4[6];
          EVar9.Data4[7] = local_190.Data4[7];
          EVar9.Data1 = local_190.Data1;
          EVar9.Data2 = local_190.Data2;
          EVar9.Data3 = local_190.Data3;
          this_local = (FfsParser *)0x0;
          goto LAB_00134fde;
        case 1:
          usprintf(&local_208,"%s: misplaced AFTER opcode","parseDepexSectionBody");
          msg(this,&local_208,index);
          Bstrlib::CBString::~CBString(&local_208);
          EVar9.Data4[0] = local_190.Data4[0];
          EVar9.Data4[1] = local_190.Data4[1];
          EVar9.Data4[2] = local_190.Data4[2];
          EVar9.Data4[3] = local_190.Data4[3];
          EVar9.Data4[4] = local_190.Data4[4];
          EVar9.Data4[5] = local_190.Data4[5];
          EVar9.Data4[6] = local_190.Data4[6];
          EVar9.Data4[7] = local_190.Data4[7];
          EVar9.Data1 = local_190.Data1;
          EVar9.Data2 = local_190.Data2;
          EVar9.Data3 = local_190.Data3;
          this_local = (FfsParser *)0x0;
          goto LAB_00134fde;
        case 2:
          iVar6 = UByteArray::size((UByteArray *)&parsed.super_tagbstring.data);
          pbVar8 = local_98;
          pcVar7 = UByteArray::constData((UByteArray *)&parsed.super_tagbstring.data);
          if ((uint)(iVar6 - ((int)pbVar8 - (int)pcVar7)) < 0x12) {
            Bstrlib::CBString::clear((CBString *)local_58);
            usprintf(&local_238,"%s: remains of DEPEX section too short for PUSH opcode",
                     "parseDepexSectionBody");
            msg(this,&local_238,index);
            Bstrlib::CBString::~CBString(&local_238);
            EVar9.Data4[0] = local_190.Data4[0];
            EVar9.Data4[1] = local_190.Data4[1];
            EVar9.Data4[2] = local_190.Data4[2];
            EVar9.Data4[3] = local_190.Data4[3];
            EVar9.Data4[4] = local_190.Data4[4];
            EVar9.Data4[5] = local_190.Data4[5];
            EVar9.Data4[6] = local_190.Data4[6];
            EVar9.Data4[7] = local_190.Data4[7];
            EVar9.Data1 = local_190.Data1;
            EVar9.Data2 = local_190.Data2;
            EVar9.Data3 = local_190.Data3;
            this_local = (FfsParser *)0x0;
            goto LAB_00134fde;
          }
          current = local_98 + 1;
          Bstrlib::CBString::CBString(&local_268,"\nPUSH ");
          EVar9 = readUnaligned<EFI_GUID_>((EFI_GUID_ *)current);
          local_290 = EVar9;
          guidToUString(&local_280,&local_290,true);
          Bstrlib::CBString::operator+(&local_250,&local_268,&local_280);
          Bstrlib::CBString::operator+=((CBString *)local_58,&local_250);
          Bstrlib::CBString::~CBString(&local_250);
          Bstrlib::CBString::~CBString(&local_280);
          Bstrlib::CBString::~CBString(&local_268);
          local_98 = local_98 + 0x11;
          break;
        case 3:
          Bstrlib::CBString::CBString(&local_2a8,"\nAND");
          Bstrlib::CBString::operator+=((CBString *)local_58,&local_2a8);
          Bstrlib::CBString::~CBString(&local_2a8);
          local_98 = local_98 + 1;
          break;
        case 4:
          Bstrlib::CBString::CBString(&local_2c0,"\nOR");
          Bstrlib::CBString::operator+=((CBString *)local_58,&local_2c0);
          Bstrlib::CBString::~CBString(&local_2c0);
          local_98 = local_98 + 1;
          break;
        case 5:
          Bstrlib::CBString::CBString(&local_2d8,"\nNOT");
          Bstrlib::CBString::operator+=((CBString *)local_58,&local_2d8);
          Bstrlib::CBString::~CBString(&local_2d8);
          local_98 = local_98 + 1;
          break;
        case 6:
          Bstrlib::CBString::CBString(&local_2f0,"\nTRUE");
          Bstrlib::CBString::operator+=((CBString *)local_58,&local_2f0);
          Bstrlib::CBString::~CBString(&local_2f0);
          local_98 = local_98 + 1;
          break;
        case 7:
          Bstrlib::CBString::CBString(&local_308,"\nFALSE");
          Bstrlib::CBString::operator+=((CBString *)local_58,&local_308);
          Bstrlib::CBString::~CBString(&local_308);
          local_98 = local_98 + 1;
          break;
        case 8:
          Bstrlib::CBString::CBString(&local_320,"\nEND");
          Bstrlib::CBString::operator+=((CBString *)local_58,&local_320);
          Bstrlib::CBString::~CBString(&local_320);
          pbVar8 = local_98 + 1;
          local_98 = pbVar8;
          pcVar7 = UByteArray::constData((UByteArray *)&parsed.super_tagbstring.data);
          iVar6 = UByteArray::size((UByteArray *)&parsed.super_tagbstring.data);
          if ((long)pbVar8 - (long)pcVar7 < (long)iVar6) {
            Bstrlib::CBString::clear((CBString *)local_58);
            usprintf(&local_338,"%s: DEPEX section ends with non-END opcode","parseDepexSectionBody"
                    );
            msg(this,&local_338,index);
            Bstrlib::CBString::~CBString(&local_338);
          }
          break;
        case 9:
          usprintf(&local_220,"%s: misplaced SOR opcode","parseDepexSectionBody");
          msg(this,&local_220,index);
          Bstrlib::CBString::~CBString(&local_220);
          EVar9.Data4[0] = local_190.Data4[0];
          EVar9.Data4[1] = local_190.Data4[1];
          EVar9.Data4[2] = local_190.Data4[2];
          EVar9.Data4[3] = local_190.Data4[3];
          EVar9.Data4[4] = local_190.Data4[4];
          EVar9.Data4[5] = local_190.Data4[5];
          EVar9.Data4[6] = local_190.Data4[6];
          EVar9.Data4[7] = local_190.Data4[7];
          EVar9.Data1 = local_190.Data1;
          EVar9.Data2 = local_190.Data2;
          EVar9.Data3 = local_190.Data3;
          this_local = (FfsParser *)0x0;
          goto LAB_00134fde;
        default:
          usprintf(&local_350,"%s: unknown opcode %02Xh","parseDepexSectionBody",(ulong)*local_98);
          msg(this,&local_350,index);
          Bstrlib::CBString::~CBString(&local_350);
          EVar9.Data4[0] = local_190.Data4[0];
          EVar9.Data4[1] = local_190.Data4[1];
          EVar9.Data4[2] = local_190.Data4[2];
          EVar9.Data4[3] = local_190.Data4[3];
          EVar9.Data4[4] = local_190.Data4[4];
          EVar9.Data4[5] = local_190.Data4[5];
          EVar9.Data4[6] = local_190.Data4[6];
          EVar9.Data4[7] = local_190.Data4[7];
          EVar9.Data1 = local_190.Data1;
          EVar9.Data2 = local_190.Data2;
          EVar9.Data3 = local_190.Data3;
          this_local = (FfsParser *)0x0;
          goto LAB_00134fde;
        }
      }
      this_00 = this->model;
      Bstrlib::CBString::CBString(&local_380,"\nParsed expression:");
      Bstrlib::CBString::operator+(&local_368,&local_380,(CBString *)local_58);
      TreeModel::addInfo(this_00,index,&local_368,true);
      Bstrlib::CBString::~CBString(&local_368);
      Bstrlib::CBString::~CBString(&local_380);
      EVar9.Data4[0] = local_190.Data4[0];
      EVar9.Data4[1] = local_190.Data4[1];
      EVar9.Data4[2] = local_190.Data4[2];
      EVar9.Data4[3] = local_190.Data4[3];
      EVar9.Data4[4] = local_190.Data4[4];
      EVar9.Data4[5] = local_190.Data4[5];
      EVar9.Data4[6] = local_190.Data4[6];
      EVar9.Data4[7] = local_190.Data4[7];
      EVar9.Data1 = local_190.Data1;
      EVar9.Data2 = local_190.Data2;
      EVar9.Data3 = local_190.Data3;
      this_local = (FfsParser *)0x0;
    }
  }
LAB_00134fde:
  guid._4_4_ = 1;
  local_190 = EVar9;
  Bstrlib::CBString::~CBString((CBString *)local_58);
  UByteArray::~UByteArray((UByteArray *)&parsed.super_tagbstring.data);
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::parseDepexSectionBody(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    UByteArray body = model->body(index);
    UString parsed;
    
    // Check data to be present
    if (body.size() < 2) { // 2 is a minimal sane value, i.e TRUE + END
        msg(usprintf("%s: DEPEX section too short", __FUNCTION__), index);
        return U_DEPEX_PARSE_FAILED;
    }
    
    const EFI_GUID * guid;
    const UINT8* current = (const UINT8*)body.constData();
    
    // Special cases of first opcode
    switch (*current) {
        case EFI_DEP_BEFORE:
            if (body.size() != 2 * EFI_DEP_OPCODE_SIZE + sizeof(EFI_GUID)) {
                msg(usprintf("%s: DEPEX section too long for a section starting with BEFORE opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            guid = (const EFI_GUID*)(current + EFI_DEP_OPCODE_SIZE);
            parsed += UString("\nBEFORE ") + guidToUString(readUnaligned(guid));
            current += EFI_DEP_OPCODE_SIZE + sizeof(EFI_GUID);
            if (*current != EFI_DEP_END){
                msg(usprintf("%s: DEPEX section ends with non-END opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            // No further parsing required
            return U_SUCCESS;
        case EFI_DEP_AFTER:
            if (body.size() != 2 * EFI_DEP_OPCODE_SIZE + sizeof(EFI_GUID)){
                msg(usprintf("%s: DEPEX section too long for a section starting with AFTER opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            guid = (const EFI_GUID*)(current + EFI_DEP_OPCODE_SIZE);
            parsed += UString("\nAFTER ") + guidToUString(readUnaligned(guid));
            current += EFI_DEP_OPCODE_SIZE + sizeof(EFI_GUID);
            if (*current != EFI_DEP_END) {
                msg(usprintf("%s: DEPEX section ends with non-END opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            // No further parsing required
            return U_SUCCESS;
        case EFI_DEP_SOR:
            if (body.size() <= 2 * EFI_DEP_OPCODE_SIZE) {
                msg(usprintf("%s: DEPEX section too short for a section starting with SOR opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            parsed += UString("\nSOR");
            current += EFI_DEP_OPCODE_SIZE;
            break;
    }
    
    // Parse the rest of depex
    while (current - (const UINT8*)body.constData() < body.size()) {
        switch (*current) {
            case EFI_DEP_BEFORE: {
                msg(usprintf("%s: misplaced BEFORE opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            case EFI_DEP_AFTER: {
                msg(usprintf("%s: misplaced AFTER opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            case EFI_DEP_SOR: {
                msg(usprintf("%s: misplaced SOR opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            case EFI_DEP_PUSH:
                // Check that the rest of depex has correct size
                if ((UINT32)body.size() - (UINT32)(current - (const UINT8*)body.constData()) <= EFI_DEP_OPCODE_SIZE + sizeof(EFI_GUID)) {
                    parsed.clear();
                    msg(usprintf("%s: remains of DEPEX section too short for PUSH opcode", __FUNCTION__), index);
                    return U_SUCCESS;
                }
                guid = (const EFI_GUID*)(current + EFI_DEP_OPCODE_SIZE);
                parsed += UString("\nPUSH ") + guidToUString(readUnaligned(guid));
                current += EFI_DEP_OPCODE_SIZE + sizeof(EFI_GUID);
                break;
            case EFI_DEP_AND:
                parsed += UString("\nAND");
                current += EFI_DEP_OPCODE_SIZE;
                break;
            case EFI_DEP_OR:
                parsed += UString("\nOR");
                current += EFI_DEP_OPCODE_SIZE;
                break;
            case EFI_DEP_NOT:
                parsed += UString("\nNOT");
                current += EFI_DEP_OPCODE_SIZE;
                break;
            case EFI_DEP_TRUE:
                parsed += UString("\nTRUE");
                current += EFI_DEP_OPCODE_SIZE;
                break;
            case EFI_DEP_FALSE:
                parsed += UString("\nFALSE");
                current += EFI_DEP_OPCODE_SIZE;
                break;
            case EFI_DEP_END:
                parsed += UString("\nEND");
                current += EFI_DEP_OPCODE_SIZE;
                // Check that END is the last opcode
                if (current - (const UINT8*)body.constData() < body.size()) {
                    parsed.clear();
                    msg(usprintf("%s: DEPEX section ends with non-END opcode", __FUNCTION__), index);
                }
                break;
            default:
                msg(usprintf("%s: unknown opcode %02Xh", __FUNCTION__, *current), index);
                // No further parsing required
                return U_SUCCESS;
        }
    }
    
    // Add info
    model->addInfo(index, UString("\nParsed expression:") + parsed);
    
    return U_SUCCESS;
}